

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::anon_unknown_0::CopyImageTest::copyImageIter(CopyImageTest *this)

{
  ImageInfo *info;
  ImageInfo *info_00;
  deUint32 dVar1;
  TestLog *pTVar2;
  State *pSVar3;
  ObjectWrapper *pOVar4;
  ObjectWrapper *pOVar5;
  pointer pAVar6;
  pointer pAVar7;
  void *pvVar8;
  int iVar9;
  int iVar10;
  pointer pCVar11;
  int i;
  int iVar12;
  deUint32 dVar13;
  int iVar14;
  undefined4 extraout_var;
  long lVar15;
  int i_27;
  uint uVar16;
  int iVar17;
  int i_35;
  int iVar18;
  int iVar19;
  ulong uVar20;
  byte bVar21;
  int iVar22;
  int iVar23;
  pointer vec;
  byte bVar24;
  uint uVar25;
  ostringstream *this_00;
  bool bVar26;
  IVec3 copyBlockSize;
  IVec3 srcPos;
  IVec3 dstPos;
  IVec3 srcBlockPos;
  IVec3 srcCopySize;
  IVec3 dstCopySize;
  IVec3 dstBlockPos;
  IVec3 srcBlockPixelSize;
  IVec3 dstCompleteBlockSize;
  IVec3 dstSize;
  IVec3 dstBlockPixelSize;
  IVec3 maxCopyBlockSize;
  pointer local_260;
  IVec3 srcSize;
  IVec3 srcCompleteBlockSize;
  vector<deqp::gles31::Functional::(anonymous_namespace)::Copy,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Copy>_>
  copies;
  Vector<int,_3> res_13;
  ios_base local_138 [264];
  
  pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  iVar12 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  pSVar3 = this->m_state;
  pOVar4 = pSVar3->srcImage;
  pOVar5 = pSVar3->dstImage;
  copies.
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Copy,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Copy>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  copies.
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Copy,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Copy>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  copies.
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Copy,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Copy>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  dVar13 = (this->m_srcImageInfo).m_target;
  dVar1 = (this->m_dstImageInfo).m_target;
  getTexelBlockPixelSize((anon_unknown_0 *)&srcBlockPixelSize,(this->m_srcImageInfo).m_format);
  info_00 = &this->m_dstImageInfo;
  getTexelBlockPixelSize((anon_unknown_0 *)&dstBlockPixelSize,info_00->m_format);
  info = &this->m_srcImageInfo;
  uVar20 = 0;
  do {
    bVar24 = 0;
    if (dVar13 != 0x8d41) {
      if (uVar20 < 2) {
        bVar24 = (byte)(&DAT_009ca448)[uVar20];
      }
      else {
        iVar18 = getLastFullLevel(info);
        bVar24 = (byte)iVar18;
      }
    }
    bVar21 = 0;
    if (dVar1 != 0x8d41) {
      if (uVar20 < 2) {
        bVar21 = (byte)(&DAT_009ca448)[uVar20];
      }
      else {
        iVar18 = getLastFullLevel(info_00);
        bVar21 = (byte)iVar18;
      }
    }
    srcSize.m_data[2] = 0;
    srcSize.m_data[0] = 0;
    srcSize.m_data[1] = 0;
    if ((this->m_srcImageInfo).m_target == 0x8c1a) {
      lVar15 = 0;
      do {
        iVar18 = (this->m_srcImageInfo).m_size.m_data[lVar15] >> (bVar24 & 0x1f);
        if (iVar18 < 2) {
          iVar18 = 1;
        }
        srcSize.m_data[lVar15] = iVar18;
        lVar15 = lVar15 + 1;
      } while (lVar15 == 1);
      srcSize.m_data[2] = (this->m_srcImageInfo).m_size.m_data[2];
    }
    else {
      lVar15 = 0;
      do {
        iVar18 = (this->m_srcImageInfo).m_size.m_data[lVar15] >> (bVar24 & 0x1f);
        if (iVar18 < 2) {
          iVar18 = 1;
        }
        srcSize.m_data[lVar15] = iVar18;
        lVar15 = lVar15 + 1;
      } while (lVar15 != 3);
    }
    dstSize.m_data[2] = 0;
    dstSize.m_data[0] = 0;
    dstSize.m_data[1] = 0;
    if ((this->m_dstImageInfo).m_target == 0x8c1a) {
      lVar15 = 0;
      do {
        iVar18 = (this->m_dstImageInfo).m_size.m_data[lVar15] >> (bVar21 & 0x1f);
        if (iVar18 < 2) {
          iVar18 = 1;
        }
        dstSize.m_data[lVar15] = iVar18;
        lVar15 = lVar15 + 1;
      } while (lVar15 == 1);
      dstSize.m_data[2] = (this->m_dstImageInfo).m_size.m_data[2];
    }
    else {
      lVar15 = 0;
      do {
        iVar18 = (this->m_dstImageInfo).m_size.m_data[lVar15] >> (bVar21 & 0x1f);
        if (iVar18 < 2) {
          iVar18 = 1;
        }
        dstSize.m_data[lVar15] = iVar18;
        lVar15 = lVar15 + 1;
      } while (lVar15 != 3);
    }
    dstCompleteBlockSize.m_data[2] = 6;
    srcCompleteBlockSize.m_data[2] = 6;
    if (dVar13 != 0x8513) {
      srcCompleteBlockSize.m_data[2] = srcSize.m_data[2] / srcBlockPixelSize.m_data[2];
    }
    srcCompleteBlockSize.m_data[0] = srcSize.m_data[0] / srcBlockPixelSize.m_data[0];
    srcCompleteBlockSize.m_data[1] = srcSize.m_data[1] / srcBlockPixelSize.m_data[1];
    if (dVar1 != 0x8513) {
      dstCompleteBlockSize.m_data[2] = dstSize.m_data[2] / dstBlockPixelSize.m_data[2];
    }
    dstCompleteBlockSize.m_data[1] = dstSize.m_data[1] / dstBlockPixelSize.m_data[1];
    dstCompleteBlockSize.m_data[0] = dstSize.m_data[0] / dstBlockPixelSize.m_data[0];
    maxCopyBlockSize.m_data[2] = 0;
    maxCopyBlockSize.m_data[0] = 0;
    maxCopyBlockSize.m_data[1] = 0;
    lVar15 = 0;
    do {
      iVar18 = dstCompleteBlockSize.m_data[lVar15];
      if (srcCompleteBlockSize.m_data[lVar15] < dstCompleteBlockSize.m_data[lVar15]) {
        iVar18 = srcCompleteBlockSize.m_data[lVar15];
      }
      maxCopyBlockSize.m_data[lVar15] = iVar18;
      lVar15 = lVar15 + 1;
    } while (lVar15 != 3);
    iVar18 = maxCopyBlockSize.m_data[0] + 3;
    if (-1 < maxCopyBlockSize.m_data[0]) {
      iVar18 = maxCopyBlockSize.m_data[0];
    }
    iVar18 = (iVar18 >> 2) * 2;
    if (iVar18 < 3) {
      iVar18 = 2;
    }
    iVar18 = iVar18 + -1;
    iVar19 = maxCopyBlockSize.m_data[1] + 3;
    if (-1 < (long)maxCopyBlockSize.m_data._0_8_) {
      iVar19 = maxCopyBlockSize.m_data[1];
    }
    iVar19 = (iVar19 >> 2) * 2;
    if (iVar19 < 3) {
      iVar19 = 2;
    }
    iVar19 = iVar19 + -1;
    iVar23 = maxCopyBlockSize.m_data[2] + 3;
    if (-1 < maxCopyBlockSize.m_data[2]) {
      iVar23 = maxCopyBlockSize.m_data[2];
    }
    iVar23 = (iVar23 >> 2) * 2;
    if (iVar23 < 3) {
      iVar23 = 2;
    }
    iVar23 = iVar23 + -1;
    copyBlockSize.m_data[1] = iVar19;
    copyBlockSize.m_data[0] = iVar18;
    copyBlockSize.m_data[2] = iVar23;
    srcBlockPos.m_data[2] = 0;
    srcBlockPos.m_data[0] = 0;
    srcBlockPos.m_data[1] = 0;
    lVar15 = 0;
    do {
      srcBlockPos.m_data[lVar15] =
           srcCompleteBlockSize.m_data[lVar15] - copyBlockSize.m_data[lVar15];
      lVar15 = lVar15 + 1;
    } while (lVar15 != 3);
    dstBlockPos.m_data[0] = 0;
    dstBlockPos.m_data[1] = 0;
    dstBlockPos.m_data[2] = 0;
    srcPos.m_data[2] = 0;
    srcPos.m_data[0] = 0;
    srcPos.m_data[1] = 0;
    lVar15 = 0;
    do {
      srcPos.m_data[lVar15] = srcBlockPixelSize.m_data[lVar15] * srcBlockPos.m_data[lVar15];
      lVar15 = lVar15 + 1;
    } while (lVar15 != 3);
    dstPos.m_data[2] = 0;
    dstPos.m_data[0] = 0;
    dstPos.m_data[1] = 0;
    lVar15 = 0;
    do {
      dstPos.m_data[lVar15] = dstBlockPixelSize.m_data[lVar15] * dstBlockPos.m_data[lVar15];
      lVar15 = lVar15 + 1;
    } while (lVar15 != 3);
    srcCopySize.m_data[2] = 0;
    srcCopySize.m_data[0] = 0;
    srcCopySize.m_data[1] = 0;
    lVar15 = 0;
    do {
      srcCopySize.m_data[lVar15] = srcBlockPixelSize.m_data[lVar15] * copyBlockSize.m_data[lVar15];
      lVar15 = lVar15 + 1;
    } while (lVar15 != 3);
    dstCopySize.m_data[2] = 0;
    dstCopySize.m_data[0] = 0;
    dstCopySize.m_data[1] = 0;
    lVar15 = 0;
    do {
      dstCopySize.m_data[lVar15] = dstBlockPixelSize.m_data[lVar15] * copyBlockSize.m_data[lVar15];
      lVar15 = lVar15 + 1;
    } while (lVar15 != 3);
    res_13.m_data[2] = srcPos.m_data[2];
    res_13.m_data[0] = srcPos.m_data[0];
    res_13.m_data[1] = srcPos.m_data[1];
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::Copy,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Copy>_>
    ::push_back(&copies,(value_type *)&res_13);
    copyBlockSize.m_data[2] = iVar23;
    srcBlockPos.m_data[0] = 0;
    srcBlockPos.m_data[1] = 0;
    srcBlockPos.m_data[2] = 0;
    dstBlockPos.m_data[2] = 0;
    dstBlockPos.m_data[0] = 0;
    dstBlockPos.m_data[1] = 0;
    lVar15 = 0;
    do {
      dstBlockPos.m_data[lVar15] =
           dstCompleteBlockSize.m_data[lVar15] - copyBlockSize.m_data[lVar15];
      lVar15 = lVar15 + 1;
    } while (lVar15 != 3);
    srcPos.m_data[2] = 0;
    srcPos.m_data[0] = 0;
    srcPos.m_data[1] = 0;
    lVar15 = 0;
    do {
      srcPos.m_data[lVar15] = srcBlockPixelSize.m_data[lVar15] * srcBlockPos.m_data[lVar15];
      lVar15 = lVar15 + 1;
    } while (lVar15 != 3);
    dstPos.m_data[2] = 0;
    dstPos.m_data[0] = 0;
    dstPos.m_data[1] = 0;
    lVar15 = 0;
    do {
      dstPos.m_data[lVar15] = dstBlockPixelSize.m_data[lVar15] * dstBlockPos.m_data[lVar15];
      lVar15 = lVar15 + 1;
    } while (lVar15 != 3);
    srcCopySize.m_data[2] = 0;
    srcCopySize.m_data[0] = 0;
    srcCopySize.m_data[1] = 0;
    lVar15 = 0;
    do {
      srcCopySize.m_data[lVar15] = srcBlockPixelSize.m_data[lVar15] * copyBlockSize.m_data[lVar15];
      lVar15 = lVar15 + 1;
    } while (lVar15 != 3);
    dstCopySize.m_data[2] = 0;
    dstCopySize.m_data[0] = 0;
    dstCopySize.m_data[1] = 0;
    lVar15 = 0;
    do {
      dstCopySize.m_data[lVar15] = dstBlockPixelSize.m_data[lVar15] * copyBlockSize.m_data[lVar15];
      lVar15 = lVar15 + 1;
    } while (lVar15 != 3);
    res_13.m_data[2] = srcPos.m_data[2];
    res_13.m_data[0] = srcPos.m_data[0];
    res_13.m_data[1] = srcPos.m_data[1];
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::Copy,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Copy>_>
    ::push_back(&copies,(value_type *)&res_13);
    copyBlockSize.m_data[2] = iVar23;
    srcPos.m_data[2] = 0;
    srcPos.m_data[0] = 0;
    srcPos.m_data[1] = 0;
    lVar15 = 0;
    do {
      iVar18 = srcCompleteBlockSize.m_data[lVar15];
      iVar19 = iVar18 + 3;
      if (-1 < iVar18) {
        iVar19 = iVar18;
      }
      srcPos.m_data[lVar15] = iVar19 >> 2;
      lVar15 = lVar15 + 1;
    } while (lVar15 != 3);
    dstBlockPos.m_data[2] = 0;
    dstBlockPos.m_data[0] = 0;
    dstBlockPos.m_data[1] = 0;
    lVar15 = 0;
    do {
      dstBlockPos.m_data[lVar15] = srcPos.m_data[lVar15] << 2;
      lVar15 = lVar15 + 1;
    } while (lVar15 != 3);
    res_13.m_data[2] = 0;
    res_13.m_data[0] = 0;
    res_13.m_data[1] = 0;
    lVar15 = 0;
    do {
      res_13.m_data[lVar15] = dstBlockPos.m_data[lVar15] - copyBlockSize.m_data[lVar15];
      lVar15 = lVar15 + 1;
    } while (lVar15 != 3);
    dstPos.m_data[2] = 0;
    dstPos.m_data[0] = 0;
    dstPos.m_data[1] = 0;
    srcBlockPos.m_data[2] = 0;
    srcBlockPos.m_data[0] = 0;
    srcBlockPos.m_data[1] = 0;
    lVar15 = 0;
    do {
      iVar18 = dstPos.m_data[lVar15];
      if (dstPos.m_data[lVar15] < res_13.m_data[lVar15]) {
        iVar18 = res_13.m_data[lVar15];
      }
      srcBlockPos.m_data[lVar15] = iVar18;
      lVar15 = lVar15 + 1;
    } while (lVar15 != 3);
    dstPos.m_data[2] = 0;
    dstPos.m_data[0] = 0;
    dstPos.m_data[1] = 0;
    lVar15 = 0;
    do {
      iVar18 = dstCompleteBlockSize.m_data[lVar15];
      iVar19 = iVar18 + 3;
      if (-1 < iVar18) {
        iVar19 = iVar18;
      }
      dstPos.m_data[lVar15] = iVar19 >> 2;
      lVar15 = lVar15 + 1;
    } while (lVar15 != 3);
    srcPos.m_data[2] = 0;
    srcPos.m_data[0] = 0;
    srcPos.m_data[1] = 0;
    lVar15 = 0;
    do {
      srcPos.m_data[lVar15] = dstPos.m_data[lVar15] << 2;
      lVar15 = lVar15 + 1;
    } while (lVar15 != 3);
    res_13.m_data[2] = 0;
    res_13.m_data[0] = 0;
    res_13.m_data[1] = 0;
    lVar15 = 0;
    do {
      res_13.m_data[lVar15] = srcPos.m_data[lVar15] - copyBlockSize.m_data[lVar15];
      lVar15 = lVar15 + 1;
    } while (lVar15 != 3);
    srcCopySize.m_data[2] = 0;
    srcCopySize.m_data[0] = 0;
    srcCopySize.m_data[1] = 0;
    dstBlockPos.m_data[2] = 0;
    dstBlockPos.m_data[0] = 0;
    dstBlockPos.m_data[1] = 0;
    lVar15 = 0;
    do {
      iVar18 = srcCopySize.m_data[lVar15];
      if (srcCopySize.m_data[lVar15] < res_13.m_data[lVar15]) {
        iVar18 = res_13.m_data[lVar15];
      }
      dstBlockPos.m_data[lVar15] = iVar18;
      lVar15 = lVar15 + 1;
    } while (lVar15 != 3);
    srcPos.m_data[2] = 0;
    srcPos.m_data[0] = 0;
    srcPos.m_data[1] = 0;
    lVar15 = 0;
    do {
      srcPos.m_data[lVar15] = srcBlockPixelSize.m_data[lVar15] * srcBlockPos.m_data[lVar15];
      lVar15 = lVar15 + 1;
    } while (lVar15 != 3);
    dstPos.m_data[2] = 0;
    dstPos.m_data[0] = 0;
    dstPos.m_data[1] = 0;
    lVar15 = 0;
    do {
      dstPos.m_data[lVar15] = dstBlockPixelSize.m_data[lVar15] * dstBlockPos.m_data[lVar15];
      lVar15 = lVar15 + 1;
    } while (lVar15 != 3);
    srcCopySize.m_data[2] = 0;
    srcCopySize.m_data[0] = 0;
    srcCopySize.m_data[1] = 0;
    lVar15 = 0;
    do {
      srcCopySize.m_data[lVar15] = srcBlockPixelSize.m_data[lVar15] * copyBlockSize.m_data[lVar15];
      lVar15 = lVar15 + 1;
    } while (lVar15 != 3);
    dstCopySize.m_data[2] = 0;
    dstCopySize.m_data[0] = 0;
    dstCopySize.m_data[1] = 0;
    lVar15 = 0;
    do {
      dstCopySize.m_data[lVar15] = dstBlockPixelSize.m_data[lVar15] * copyBlockSize.m_data[lVar15];
      lVar15 = lVar15 + 1;
    } while (lVar15 != 3);
    res_13.m_data[2] = srcPos.m_data[2];
    res_13.m_data[0] = srcPos.m_data[0];
    res_13.m_data[1] = srcPos.m_data[1];
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::Copy,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Copy>_>
    ::push_back(&copies,(value_type *)&res_13);
    pCVar11 = copies.
              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Copy,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Copy>_>
              ._M_impl.super__Vector_impl_data._M_start;
    bVar26 = uVar20 < 2;
    uVar20 = uVar20 + 1;
  } while ((dVar13 != 0x8d41 || dVar1 != 0x8d41) && bVar26);
  uVar16 = (int)((long)copies.
                       super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Copy,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Copy>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)copies.
                       super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Copy,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Copy>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x49249249;
  if (0 < (int)uVar16) {
    local_260 = copies.
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Copy,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Copy>_>
                ._M_impl.super__Vector_impl_data._M_start;
    uVar20 = 0;
    do {
      this_00 = (ostringstream *)(res_13.m_data + 2);
      res_13.m_data._0_8_ = pTVar2;
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,"Copying area with size ",0x17);
      vec = pCVar11 + uVar20;
      tcu::operator<<((ostream *)this_00,&vec->size);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00," from source image position ",0x1c);
      tcu::operator<<((ostream *)this_00,&vec->srcPos);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00," and mipmap level ",0x12);
      std::ostream::operator<<(this_00,vec->srcLevel);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00," to destination image position ",0x1f);
      tcu::operator<<((ostream *)this_00,&vec->dstPos);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00," and mipmap level ",0x12);
      std::ostream::operator<<(this_00,vec->dstLevel);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,". ",2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,"Size in destination format is ",0x1e);
      tcu::operator<<((ostream *)this_00,&vec->dstSize);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&res_13,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this_00);
      std::ios_base::~ios_base(local_138);
      iVar18 = vec->dstLevel;
      iVar19 = vec->srcLevel;
      (**(code **)(CONCAT44(extraout_var,iVar12) + 0x310))
                (pOVar4->m_object,(this->m_srcImageInfo).m_target,iVar19,(vec->srcPos).m_data[0],
                 (vec->srcPos).m_data[1],(vec->srcPos).m_data[2],pOVar5->m_object,
                 (this->m_dstImageInfo).m_target,(long)iVar18,(vec->dstPos).m_data[0],
                 (vec->dstPos).m_data[1],(vec->dstPos).m_data[2],(vec->size).m_data[0],
                 (vec->size).m_data[1],(vec->size).m_data[2]);
      dVar13 = (**(code **)(CONCAT44(extraout_var,iVar12) + 0x800))();
      glu::checkError(dVar13,"glCopyImageSubData failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fCopyImageTests.cpp"
                      ,0x460);
      pAVar6 = (pSVar3->srcImageLevels).
               super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pAVar7 = (pSVar3->dstImageLevels).
               super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      getTexelBlockPixelSize((anon_unknown_0 *)&res_13,info->m_format);
      iVar23 = getTexelBlockSize(info->m_format);
      srcBlockPixelSize.m_data[2] = 0;
      srcBlockPixelSize.m_data[0] = 0;
      srcBlockPixelSize.m_data[1] = 0;
      lVar15 = 0;
      do {
        srcBlockPixelSize.m_data[lVar15] =
             (local_260->srcPos).m_data[lVar15] / res_13.m_data[lVar15];
        lVar15 = lVar15 + 1;
      } while (lVar15 != 3);
      getTexelBlockStride((anon_unknown_0 *)&dstBlockPixelSize,info,iVar19);
      getTexelBlockPixelSize((anon_unknown_0 *)&srcSize,info_00->m_format);
      getTexelBlockSize(info_00->m_format);
      dstSize.m_data[2] = 0;
      dstSize.m_data[0] = 0;
      dstSize.m_data[1] = 0;
      lVar15 = 0;
      do {
        dstSize.m_data[lVar15] = (local_260->dstPos).m_data[lVar15] / srcSize.m_data[lVar15];
        lVar15 = lVar15 + 1;
      } while (lVar15 != 3);
      getTexelBlockStride((anon_unknown_0 *)&srcCompleteBlockSize,info_00,iVar18);
      dstCompleteBlockSize.m_data[2] = 0;
      dstCompleteBlockSize.m_data[0] = 0;
      dstCompleteBlockSize.m_data[1] = 0;
      lVar15 = 0;
      do {
        dstCompleteBlockSize.m_data[lVar15] =
             (local_260->size).m_data[lVar15] / res_13.m_data[lVar15];
        iVar10 = dstCompleteBlockSize.m_data[2];
        lVar15 = lVar15 + 1;
      } while (lVar15 != 3);
      if (0 < dstCompleteBlockSize.m_data[2]) {
        iVar9 = dstCompleteBlockSize.m_data[1];
        iVar23 = iVar23 * dstCompleteBlockSize.m_data[0];
        iVar22 = 0;
        do {
          if (0 < iVar9) {
            uVar25 = 0;
            do {
              maxCopyBlockSize.m_data._0_8_ = (ulong)uVar25 << 0x20;
              maxCopyBlockSize.m_data[2] = iVar22;
              srcBlockPos.m_data[2] = 0;
              srcBlockPos.m_data[0] = 0;
              srcBlockPos.m_data[1] = 0;
              lVar15 = 0;
              do {
                srcBlockPos.m_data[lVar15] =
                     maxCopyBlockSize.m_data[lVar15] + srcBlockPixelSize.m_data[lVar15];
                lVar15 = lVar15 + 1;
              } while (lVar15 != 3);
              copyBlockSize.m_data[2] = 0;
              copyBlockSize.m_data[0] = 0;
              copyBlockSize.m_data[1] = 0;
              lVar15 = 0;
              do {
                copyBlockSize.m_data[lVar15] =
                     dstBlockPixelSize.m_data[lVar15] * srcBlockPos.m_data[lVar15];
                lVar15 = lVar15 + 1;
              } while (lVar15 != 3);
              lVar15 = 0;
              iVar14 = 0;
              do {
                iVar14 = iVar14 + copyBlockSize.m_data[lVar15];
                lVar15 = lVar15 + 1;
              } while (lVar15 != 3);
              pvVar8 = pAVar6[iVar19].m_ptr;
              srcBlockPos.m_data[2] = 0;
              srcBlockPos.m_data[0] = 0;
              srcBlockPos.m_data[1] = 0;
              lVar15 = 0;
              do {
                srcBlockPos.m_data[lVar15] =
                     maxCopyBlockSize.m_data[lVar15] + dstSize.m_data[lVar15];
                lVar15 = lVar15 + 1;
              } while (lVar15 != 3);
              copyBlockSize.m_data[2] = 0;
              copyBlockSize.m_data[0] = 0;
              copyBlockSize.m_data[1] = 0;
              lVar15 = 0;
              do {
                copyBlockSize.m_data[lVar15] =
                     srcCompleteBlockSize.m_data[lVar15] * srcBlockPos.m_data[lVar15];
                lVar15 = lVar15 + 1;
              } while (lVar15 != 3);
              lVar15 = 0;
              iVar17 = 0;
              do {
                iVar17 = iVar17 + copyBlockSize.m_data[lVar15];
                lVar15 = lVar15 + 1;
              } while (lVar15 != 3);
              memcpy((void *)((long)iVar17 + (long)pAVar7[iVar18].m_ptr),
                     (void *)((long)pvVar8 + (long)iVar14),(long)iVar23);
              uVar25 = uVar25 + 1;
            } while (uVar25 != iVar9);
          }
          iVar22 = iVar22 + 1;
        } while (iVar22 != iVar10);
      }
      uVar20 = uVar20 + 1;
      local_260 = local_260 + 1;
    } while (uVar20 != (uVar16 & 0x7fffffff));
  }
  if (pCVar11 != (pointer)0x0) {
    operator_delete(pCVar11,(long)copies.
                                  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Copy,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Copy>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pCVar11
                   );
  }
  return;
}

Assistant:

void CopyImageTest::copyImageIter (void)
{
	TestLog&						log				= m_testCtx.getLog();
	const glw::Functions&			gl				= m_context.getRenderContext().getFunctions();
	glu::ObjectWrapper&				srcImage		= *m_state->srcImage;
	glu::ObjectWrapper&				dstImage		= *m_state->dstImage;

	vector<ArrayBuffer<deUint8> >&	srcImageLevels	= m_state->srcImageLevels;
	vector<ArrayBuffer<deUint8> >&	dstImageLevels	= m_state->dstImageLevels;
	vector<Copy>					copies;

	generateCopies(copies, m_srcImageInfo, m_dstImageInfo);

	for (int copyNdx = 0; copyNdx < (int)copies.size(); copyNdx++)
	{
		const Copy& copy = copies[copyNdx];

		log	<< TestLog::Message
			<< "Copying area with size " << copy.size
			<< " from source image position " << copy.srcPos << " and mipmap level " << copy.srcLevel
			<< " to destination image position " << copy.dstPos << " and mipmap level " << copy.dstLevel << ". "
			<< "Size in destination format is " << copy.dstSize
			<< TestLog::EndMessage;

		copyImage(gl, *dstImage, dstImageLevels, m_dstImageInfo, copy.dstLevel, copy.dstPos,
					  *srcImage, srcImageLevels, m_srcImageInfo, copy.srcLevel, copy.srcPos, copy.size);
	}
}